

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.h
# Opt level: O1

bool __thiscall
draco::GeometryAttribute::ConvertTypedValue<float,int>
          (GeometryAttribute *this,AttributeValueIndex att_id,uint8_t out_num_components,
          int *out_value)

{
  bool bVar1;
  float fVar2;
  float *pfVar3;
  int iVar4;
  uint uVar5;
  byte bVar6;
  float *pfVar7;
  ulong uVar8;
  bool bVar9;
  double dVar10;
  
  uVar5 = *(uint *)&this->num_components_;
  bVar6 = out_num_components;
  if ((byte)uVar5 < out_num_components) {
    bVar6 = (byte)uVar5;
  }
  bVar9 = bVar6 == 0;
  if (bVar9) {
LAB_00119308:
    if ((byte)uVar5 < out_num_components) {
      memset(out_value + (uVar5 & 0xff),0,
             (ulong)((uint)out_num_components + ~(uVar5 & 0xff)) * 4 + 4);
    }
  }
  else {
    pfVar7 = (float *)((this->buffer_->data_).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start +
                      this->byte_offset_ + (ulong)att_id.value_ * this->byte_stride_);
    pfVar3 = (float *)(this->buffer_->data_).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish;
    if (pfVar7 < pfVar3) {
      bVar1 = this->normalized_;
      uVar8 = 1;
      while( true ) {
        fVar2 = *pfVar7;
        if (((2.1474836e+09 <= fVar2) || (fVar2 < -2.1474836e+09)) ||
           (0x7f7fffff < (uint)ABS(fVar2))) break;
        if ((bVar1 & 1U) == 0) {
          iVar4 = (int)fVar2;
        }
        else {
          if (1.0 < fVar2) {
            return bVar9;
          }
          if (fVar2 < 0.0) {
            return bVar9;
          }
          dVar10 = floor((double)fVar2 * 2147483647.0 + 0.5);
          iVar4 = (int)dVar10;
        }
        out_value[uVar8 - 1] = iVar4;
        uVar5 = *(uint *)&this->num_components_;
        bVar6 = (byte)uVar5;
        if (out_num_components <= (byte)uVar5) {
          bVar6 = out_num_components;
        }
        bVar9 = bVar6 <= uVar8;
        if (bVar9) goto LAB_00119308;
        pfVar7 = pfVar7 + 1;
        uVar8 = uVar8 + 1;
        if (pfVar3 <= pfVar7) {
          return bVar9;
        }
      }
    }
  }
  return bVar9;
}

Assistant:

bool ConvertTypedValue(AttributeValueIndex att_id, uint8_t out_num_components,
                         OutT *out_value) const {
    const uint8_t *src_address = GetAddress(att_id);

    // Convert all components available in both the original and output formats.
    for (int i = 0; i < std::min(num_components_, out_num_components); ++i) {
      if (!IsAddressValid(src_address)) {
        return false;
      }
      const T in_value = *reinterpret_cast<const T *>(src_address);
      if (!ConvertComponentValue<T, OutT>(in_value, normalized_,
                                          out_value + i)) {
        return false;
      }
      src_address += sizeof(T);
    }
    // Fill empty data for unused output components if needed.
    for (int i = num_components_; i < out_num_components; ++i) {
      out_value[i] = static_cast<OutT>(0);
    }
    return true;
  }